

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::inSpace(Tokenizer *this,char ch)

{
  bool bVar1;
  char ch_local;
  Tokenizer *this_local;
  
  bVar1 = isSpace(this,ch);
  if (!bVar1) {
    this->type = tt_space;
    this->in_token = false;
    this->char_to_unread = ch;
    this->state = st_token_ready;
  }
  return;
}

Assistant:

void
Tokenizer::inSpace(char ch)
{
    // We only enter this state if include_ignorable is true.
    if (!isSpace(ch)) {
        type = tt::tt_space;
        in_token = false;
        char_to_unread = ch;
        state = st_token_ready;
    }
}